

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.hpp
# Opt level: O3

string * __thiscall
CommandLineParseResult::getValue_abi_cxx11_
          (string *__return_storage_ptr__,CommandLineParseResult *this,Option *option)

{
  const_iterator cVar1;
  allocator<char> local_11;
  
  cVar1 = std::
          _Hashtable<Option,_std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Option>,_std::hash<Option>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->options)._M_h,option);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,option->defaultValue,&local_11);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               *(long *)((long)cVar1.
                               super__Node_iterator_base<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x30),
               *(long *)((long)cVar1.
                               super__Node_iterator_base<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x38) +
               *(long *)((long)cVar1.
                               super__Node_iterator_base<std::pair<const_Option,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x30));
  }
  return __return_storage_ptr__;
}

Assistant:

auto getValue(const Option& option) -> std::string {
        auto search = options.find(option);
        if (search == options.end())
            return option.defaultValue;

        return search->second;
    }